

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O2

bool Limonp::Logger::Logging(uint level,string *msg,char *fileName,int lineNo)

{
  ostream *poVar1;
  tm *__tp;
  size_t sVar2;
  bool bVar3;
  time_t timeNow;
  char buf [1024];
  
  if (level < 5) {
    time(&timeNow);
    __tp = localtime(&timeNow);
    sVar2 = strftime(buf,0x400,"%Y-%m-%d %H:%M:%S",__tp);
    bVar3 = sVar2 != 0;
    if (sVar2 == 0) {
      fwrite("stftime failed.\n",0x10,1,_stderr);
    }
    else {
      fprintf(_stderr,"%s %s:%d %s %s\n",buf,fileName,(ulong)(uint)lineNo,
              _ZN6LimonpL15LOG_LEVEL_ARRAYE_rel +
              *(int *)(_ZN6LimonpL15LOG_LEVEL_ARRAYE_rel + (ulong)level * 4),(msg->_M_dataplus)._M_p
             );
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"level\'s value is out of range");
    std::endl<char,std::char_traits<char>>(poVar1);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool Logging(uint level, const string& msg, const char* fileName, int lineNo)
            {
                if(level > LL_FATAL)
                {
                    cerr<<"level's value is out of range"<<endl;
                    return false;
                }
                char buf[CSTR_BUFFER_SIZE];
                time_t timeNow;
                time(&timeNow);
                size_t ret = strftime(buf, sizeof(buf), LOG_TIME_FORMAT, localtime(&timeNow));
                if(0 == ret)
                {
                    fprintf(stderr, "stftime failed.\n");
                    return false;
                }
                fprintf(stderr, LOG_FORMAT, buf, fileName, lineNo,LOG_LEVEL_ARRAY[level], msg.c_str());
                return true;
            }